

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void mi_heap_buf_print_count_value(mi_heap_buf_t *hbuf,char *name,mi_stat_count_t *stat)

{
  char buf [128];
  char local_a8 [127];
  undefined1 local_29;
  
  _mi_snprintf(buf,0x80,"  \"%s\": ",name);
  buf[0x7f] = '\0';
  mi_heap_buf_print(hbuf,buf);
  _mi_snprintf(local_a8,0x80,"%s{ \"total\": %lld, \"peak\": %lld, \"current\": %lld }%s\n","",
               stat->total,stat->peak,stat->current,",");
  local_29 = 0;
  mi_heap_buf_print(hbuf,local_a8);
  return;
}

Assistant:

static void mi_heap_buf_print_count_value(mi_heap_buf_t* hbuf, const char* name, mi_stat_count_t* stat) {
  char buf[128];
  _mi_snprintf(buf, 128, "  \"%s\": ", name);
  buf[127] = 0;
  mi_heap_buf_print(hbuf, buf);
  mi_heap_buf_print_count(hbuf, "", stat, true);
}